

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entities.c
# Opt level: O1

Bool prvTidyEntityInfo(ctmbstr name,Bool isXml,uint *code,uint *versions)

{
  char cVar1;
  uint in_EAX;
  int iVar2;
  char *pcVar3;
  entity *peVar4;
  ctmbstr ptVar5;
  uint c;
  undefined8 uStack_38;
  
  if ((name == (ctmbstr)0x0) || (*name != '&')) {
    __assert_fail("name && name[0] == \'&\'",
                  "/workspace/llm4binary/github/license_c_cmakelists/lovasoa[P]tidy-html5/src/entities.c"
                  ,0x163,"Bool prvTidyEntityInfo(ctmbstr, Bool, uint *, uint *)");
  }
  if (code == (uint *)0x0) {
    __assert_fail("code != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/lovasoa[P]tidy-html5/src/entities.c"
                  ,0x164,"Bool prvTidyEntityInfo(ctmbstr, Bool, uint *, uint *)");
  }
  if (versions == (uint *)0x0) {
    __assert_fail("versions != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/lovasoa[P]tidy-html5/src/entities.c"
                  ,0x165,"Bool prvTidyEntityInfo(ctmbstr, Bool, uint *, uint *)");
  }
  cVar1 = name[1];
  if (cVar1 == '#') {
    uStack_38 = (ulong)in_EAX;
    if ((name[2] == 'x') || (name[2] == 'X' && isXml == no)) {
      ptVar5 = name + 3;
      pcVar3 = "%x";
    }
    else {
      ptVar5 = name + 2;
      pcVar3 = "%u";
    }
    __isoc99_sscanf(ptVar5,pcVar3,(long)&uStack_38 + 4);
    *code = uStack_38._4_4_;
    *versions = 0x61fff;
  }
  else {
    if (cVar1 != '\0') {
      peVar4 = entities;
      do {
        ptVar5 = peVar4->name;
        if (ptVar5 == (ctmbstr)0x0) break;
        if ((cVar1 == *ptVar5) && (iVar2 = prvTidytmbstrcmp(name + 1,ptVar5), iVar2 == 0))
        goto LAB_00130d6c;
        peVar4 = peVar4 + 1;
      } while (cVar1 != '\0');
    }
    peVar4 = (entity *)0x0;
LAB_00130d6c:
    if (peVar4 == (entity *)0x0) {
      *code = 0;
      *versions = (uint)(isXml != no) * 0x2000 + 0xe000;
      return no;
    }
    *code = peVar4->code;
    *versions = peVar4->versions;
  }
  return yes;
}

Assistant:

Bool TY_(EntityInfo)( ctmbstr name, Bool isXml, uint* code, uint* versions )
{
    const entity* np;
    assert( name && name[0] == '&' );
    assert( code != NULL );
    assert( versions != NULL );

    /* numeric entitity: name = "&#" followed by number */
    if ( name[1] == '#' )
    {
        uint c = 0;  /* zero on missing/bad number */

        /* 'x' prefix denotes hexadecimal number format */
        if ( name[2] == 'x' || (!isXml && name[2] == 'X') )
            sscanf( name+3, "%x", &c );
        else
            sscanf( name+2, "%u", &c );

        *code = c;
        *versions = VERS_ALL;
        return yes;
    }

    /* Named entity: name ="&" followed by a name */
    if ( NULL != (np = entitiesLookup(name+1)) )
    {
        *code = np->code;
        *versions = np->versions;
        return yes;
    }

    *code = 0;
    *versions = ( isXml ? VERS_XML : VERS_PROPRIETARY );
    return no;
}